

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::ByteSizeLong
          (CustomModel_CustomModelParamValue *this)

{
  bool bVar1;
  ValueCase VVar2;
  int32_t value;
  int size;
  int64_t value_00;
  string *psVar3;
  long lVar4;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  CustomModel_CustomModelParamValue *this_local;
  
  _cached_size = 0;
  VVar2 = value_case(this);
  switch(VVar2) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    _cached_size = 9;
    break;
  case kStringValue:
    psVar3 = _internal_stringvalue_abi_cxx11_(this);
    _cached_size = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
    _cached_size = _cached_size + 2;
    break;
  case kIntValue:
    value = _internal_intvalue(this);
    _cached_size = google::protobuf::internal::WireFormatLite::Int32Size(value);
    _cached_size = _cached_size + 2;
    break;
  case kLongValue:
    value_00 = _internal_longvalue(this);
    _cached_size = google::protobuf::internal::WireFormatLite::Int64Size(value_00);
    _cached_size = _cached_size + 2;
    break;
  case kBoolValue:
    _cached_size = 3;
    break;
  case kBytesValue:
    psVar3 = _internal_bytesvalue_abi_cxx11_(this);
    _cached_size = google::protobuf::internal::WireFormatLite::BytesSize(psVar3);
    _cached_size = _cached_size + 2;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    _cached_size = lVar4 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t CustomModel_CustomModelParamValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (value_case()) {
    // double doubleValue = 10;
    case kDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // string stringValue = 20;
    case kStringValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_stringvalue());
      break;
    }
    // int32 intValue = 30;
    case kIntValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_intvalue());
      break;
    }
    // int64 longValue = 40;
    case kLongValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
          this->_internal_longvalue());
      break;
    }
    // bool boolValue = 50;
    case kBoolValue: {
      total_size += 2 + 1;
      break;
    }
    // bytes bytesValue = 60;
    case kBytesValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
          this->_internal_bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}